

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token * __thiscall
inja::Lexer::scan_body
          (Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind,
          string_view close_trim,bool trim)

{
  char cVar1;
  MinusState MVar2;
  ulong uVar3;
  size_t sVar4;
  string_view prefix;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  const_reference pvVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  MinusState current_minus_state;
  char ch;
  bool trim_local;
  Kind closeKind_local;
  Lexer *this_local;
  string_view close_local;
  
  close_local._M_len = (size_t)close._M_str;
  this_local = (Lexer *)close._M_len;
  while( true ) {
    while( true ) {
      uVar3 = this->tok_start;
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
      if (sVar7 <= uVar3) {
        make_token(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&this->m_in,this->tok_start);
      cVar1 = *pvVar8;
      if (((cVar1 != ' ') && (cVar1 != '\t')) && (cVar1 != '\r')) break;
      this->tok_start = this->tok_start + 1;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&close_trim);
    if (!bVar5) {
      bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&this->m_in,this->tok_start,0xffffffffffffffff);
      bVar5 = string_view::starts_with(bVar9,close_trim);
      if (bVar5) {
        this->state = Text;
        sVar4 = this->tok_start;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&close_trim);
        this->pos = sVar4 + sVar7;
        make_token(__return_storage_ptr__,this,closeKind);
        skip_whitespaces_and_newlines(this);
        return __return_storage_ptr__;
      }
    }
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&this->m_in,this->tok_start,0xffffffffffffffff);
    prefix._M_str = (char *)close_local._M_len;
    prefix._M_len = (size_t)this_local;
    bVar5 = string_view::starts_with(bVar9,prefix);
    if (bVar5) break;
    if (cVar1 != '\n') {
      this->pos = this->tok_start + 1;
      iVar6 = isalpha((int)cVar1);
      if (iVar6 != 0) {
        this->minus_state = Operator;
        scan_id(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      MVar2 = this->minus_state;
      if (this->minus_state == Operator) {
        this->minus_state = Number;
      }
      switch(cVar1) {
      case '!':
        goto switchD_0019bd04_caseD_21;
      case '\"':
        scan_string(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      default:
        make_token(__return_storage_ptr__,this,Unknown);
        return __return_storage_ptr__;
      case '$':
      case '@':
      case '_':
        this->minus_state = Operator;
        scan_id(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case '%':
        make_token(__return_storage_ptr__,this,Percent);
        return __return_storage_ptr__;
      case '(':
        make_token(__return_storage_ptr__,this,LeftParen);
        return __return_storage_ptr__;
      case ')':
        this->minus_state = Operator;
        make_token(__return_storage_ptr__,this,RightParen);
        return __return_storage_ptr__;
      case '*':
        make_token(__return_storage_ptr__,this,Times);
        return __return_storage_ptr__;
      case '+':
        make_token(__return_storage_ptr__,this,Plus);
        return __return_storage_ptr__;
      case ',':
        make_token(__return_storage_ptr__,this,Comma);
        return __return_storage_ptr__;
      case '-':
        if (MVar2 == Operator) {
          make_token(__return_storage_ptr__,this,Minus);
          return __return_storage_ptr__;
        }
        scan_number(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case '.':
        make_token(__return_storage_ptr__,this,Dot);
        return __return_storage_ptr__;
      case '/':
        make_token(__return_storage_ptr__,this,Slash);
        return __return_storage_ptr__;
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        this->minus_state = Operator;
        scan_number(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case ':':
        make_token(__return_storage_ptr__,this,Colon);
        return __return_storage_ptr__;
      case '<':
        uVar3 = this->pos;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
        if ((uVar3 < sVar7) &&
           (pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->pos), *pvVar8 == '=')) {
          this->pos = this->pos + 1;
          make_token(__return_storage_ptr__,this,LessEqual);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,LessThan);
        return __return_storage_ptr__;
      case '=':
        uVar3 = this->pos;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
        if ((uVar3 < sVar7) &&
           (pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->pos), *pvVar8 == '=')) {
          this->pos = this->pos + 1;
          make_token(__return_storage_ptr__,this,Equal);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,Unknown);
        return __return_storage_ptr__;
      case '>':
        uVar3 = this->pos;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
        if ((uVar3 < sVar7) &&
           (pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->pos), *pvVar8 == '=')) {
          this->pos = this->pos + 1;
          make_token(__return_storage_ptr__,this,GreaterEqual);
          return __return_storage_ptr__;
        }
        make_token(__return_storage_ptr__,this,GreaterThan);
        return __return_storage_ptr__;
      case '[':
        make_token(__return_storage_ptr__,this,LeftBracket);
        return __return_storage_ptr__;
      case ']':
        this->minus_state = Operator;
        make_token(__return_storage_ptr__,this,RightBracket);
        return __return_storage_ptr__;
      case '^':
        make_token(__return_storage_ptr__,this,Power);
        return __return_storage_ptr__;
      case '{':
        make_token(__return_storage_ptr__,this,LeftBrace);
        return __return_storage_ptr__;
      case '}':
        this->minus_state = Operator;
        make_token(__return_storage_ptr__,this,RightBrace);
        return __return_storage_ptr__;
      }
    }
    this->tok_start = this->tok_start + 1;
  }
  this->state = Text;
  sVar4 = this->tok_start;
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  this->pos = sVar4 + sVar7;
  make_token(__return_storage_ptr__,this,closeKind);
  if (!trim) {
    return __return_storage_ptr__;
  }
  skip_whitespaces_and_first_newline(this);
  return __return_storage_ptr__;
switchD_0019bd04_caseD_21:
  uVar3 = this->pos;
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in);
  if ((uVar3 < sVar7) &&
     (pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&this->m_in,this->pos), *pvVar8 == '=')) {
    this->pos = this->pos + 1;
    make_token(__return_storage_ptr__,this,NotEqual);
    return __return_storage_ptr__;
  }
  make_token(__return_storage_ptr__,this,Unknown);
  return __return_storage_ptr__;
}

Assistant:

Token scan_body(std::string_view close, Token::Kind closeKind, std::string_view close_trim = std::string_view(), bool trim = false) {
  again:
    // skip whitespace (except for \n as it might be a close)
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }
    const char ch = m_in[tok_start];
    if (ch == ' ' || ch == '\t' || ch == '\r') {
      tok_start += 1;
      goto again;
    }

    // check for close
    if (!close_trim.empty() && inja::string_view::starts_with(m_in.substr(tok_start), close_trim)) {
      state = State::Text;
      pos = tok_start + close_trim.size();
      const Token tok = make_token(closeKind);
      skip_whitespaces_and_newlines();
      return tok;
    }

    if (inja::string_view::starts_with(m_in.substr(tok_start), close)) {
      state = State::Text;
      pos = tok_start + close.size();
      const Token tok = make_token(closeKind);
      if (trim) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }

    // skip \n
    if (ch == '\n') {
      tok_start += 1;
      goto again;
    }

    pos = tok_start + 1;
    if (std::isalpha(ch)) {
      minus_state = MinusState::Operator;
      return scan_id();
    }

    const MinusState current_minus_state = minus_state;
    if (minus_state == MinusState::Operator) {
      minus_state = MinusState::Number;
    }

    switch (ch) {
    case '+':
      return make_token(Token::Kind::Plus);
    case '-':
      if (current_minus_state == MinusState::Operator) {
        return make_token(Token::Kind::Minus);
      }
      return scan_number();
    case '*':
      return make_token(Token::Kind::Times);
    case '/':
      return make_token(Token::Kind::Slash);
    case '^':
      return make_token(Token::Kind::Power);
    case '%':
      return make_token(Token::Kind::Percent);
    case '.':
      return make_token(Token::Kind::Dot);
    case ',':
      return make_token(Token::Kind::Comma);
    case ':':
      return make_token(Token::Kind::Colon);
    case '(':
      return make_token(Token::Kind::LeftParen);
    case ')':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightParen);
    case '[':
      return make_token(Token::Kind::LeftBracket);
    case ']':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBracket);
    case '{':
      return make_token(Token::Kind::LeftBrace);
    case '}':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBrace);
    case '>':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::GreaterEqual);
      }
      return make_token(Token::Kind::GreaterThan);
    case '<':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::LessEqual);
      }
      return make_token(Token::Kind::LessThan);
    case '=':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::Equal);
      }
      return make_token(Token::Kind::Unknown);
    case '!':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::NotEqual);
      }
      return make_token(Token::Kind::Unknown);
    case '\"':
      return scan_string();
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      minus_state = MinusState::Operator;
      return scan_number();
    case '_':
    case '@':
    case '$':
      minus_state = MinusState::Operator;
      return scan_id();
    default:
      return make_token(Token::Kind::Unknown);
    }
  }